

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.hpp
# Opt level: O3

bool __thiscall
OpenMD::MoleculeStamp::
addIndexSensitiveStamp<std::vector<OpenMD::FragmentStamp*,std::allocator<OpenMD::FragmentStamp*>>,OpenMD::FragmentStamp>
          (MoleculeStamp *this,
          vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_> *cont,
          FragmentStamp *stamp)

{
  pointer ppFVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  value_type local_20;
  
  uVar4 = (ulong)(uint)stamp->index_;
  ppFVar1 = (cont->
            super__Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(cont->
                super__Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1;
  uVar3 = lVar2 >> 3;
  if (uVar3 < stamp->index_ + 1) {
    local_20 = (value_type)0x0;
    std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::_M_fill_insert
              (cont,(FragmentStamp **)((long)ppFVar1 + lVar2),(uVar4 - uVar3) + 1,&local_20);
    ppFVar1 = (cont->
              super__Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else if (ppFVar1[uVar4] != (FragmentStamp *)0x0) {
    return false;
  }
  ppFVar1[uVar4] = stamp;
  return true;
}

Assistant:

bool addIndexSensitiveStamp(Cont& cont, T* stamp) {
      // typename Cont::iterator i;
      unsigned int index = stamp->getIndex();
      bool ret           = false;
      size_t size        = cont.size();

      if (size >= index + 1) {
        if (cont[index] != NULL) {
          ret = false;
        } else {
          cont[index] = stamp;
          ret         = true;
        }
      } else {
        cont.insert(cont.end(), index - cont.size() + 1, NULL);
        cont[index] = stamp;
        ret         = true;
      }

      return ret;
    }